

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O0

int json_patch_apply_move_copy
              (json_object **res,json_object *patch_elem,char *path,int move,
              json_patch_error *patch_error)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t __n;
  size_t sVar4;
  int rc;
  size_t from_s_len;
  char *from_s;
  json_object *jfrom;
  json_pointer_get_result from;
  json_pointer_array_set_cb array_set_cb;
  json_patch_error *patch_error_local;
  int move_local;
  char *path_local;
  json_object *patch_elem_local;
  json_object **res_local;
  
  iVar1 = json_object_object_get_ex(patch_elem,"from",(json_object **)&from_s);
  if (iVar1 == 0) {
    patch_error->errno_code = 0x16;
    patch_error->errmsg = "Patch does not contain a \'from\' field";
    piVar2 = __errno_location();
    *piVar2 = 0;
    res_local._4_4_ = -1;
  }
  else {
    pcVar3 = json_object_get_string((json_object *)from_s);
    __n = strlen(pcVar3);
    iVar1 = strncmp(pcVar3,path,__n);
    if (iVar1 == 0) {
      sVar4 = strlen(path);
      if (__n == sVar4) {
        res_local._4_4_ = 0;
      }
      else {
        patch_error->errno_code = 0x16;
        patch_error->errmsg = "Invalid attempt to move parent under a child";
        piVar2 = __errno_location();
        *piVar2 = 0;
        res_local._4_4_ = -1;
      }
    }
    else {
      res_local._4_4_ = json_pointer_get_internal(*res,pcVar3,(json_pointer_get_result *)&jfrom);
      if (res_local._4_4_ == 0) {
        json_object_get(from.parent);
        if (move == 0) {
          from._24_8_ = json_object_array_insert_idx_cb;
        }
        else {
          iVar1 = __json_patch_apply_remove((json_pointer_get_result *)&jfrom);
          if (iVar1 < 0) {
            json_object_put(from.parent);
            return iVar1;
          }
          from._24_8_ = json_object_array_move_cb;
        }
        res_local._4_4_ =
             json_pointer_set_with_array_cb
                       (res,path,from.parent,(json_pointer_array_set_cb)from._24_8_,&jfrom);
        if (res_local._4_4_ != 0) {
          piVar2 = __errno_location();
          patch_error->errno_code = *piVar2;
          patch_error->errmsg = "Failed to set value at path referenced by \'path\' field";
          piVar2 = __errno_location();
          *piVar2 = 0;
          json_object_put(from.parent);
        }
      }
      else {
        piVar2 = __errno_location();
        patch_error->errno_code = *piVar2;
        piVar2 = __errno_location();
        pcVar3 = "Invalid from field";
        if (*piVar2 == 2) {
          pcVar3 = "Did not find element referenced by from field";
        }
        patch_error->errmsg = pcVar3;
        piVar2 = __errno_location();
        *piVar2 = 0;
      }
    }
  }
  return res_local._4_4_;
}

Assistant:

static int json_patch_apply_move_copy(struct json_object **res,
                                      struct json_object *patch_elem,
                                      const char *path, int move, struct json_patch_error *patch_error)
{
	json_pointer_array_set_cb array_set_cb;
	struct json_pointer_get_result from;
	struct json_object *jfrom;
	const char *from_s;
	size_t from_s_len;
	int rc;

	if (!json_object_object_get_ex(patch_elem, "from", &jfrom)) {
		_set_err(EINVAL, "Patch does not contain a 'from' field");
		return -1;
	}

	from_s = json_object_get_string(jfrom);

	from_s_len = strlen(from_s);
	if (strncmp(from_s, path, from_s_len) == 0) {
		/**
		 * If lengths match, it's a noop, if they don't,
		 * then we're trying to move a parent under a child
		 * which is not allowed as per RFC 6902 section 4.4
		 *   The "from" location MUST NOT be a proper prefix of the "path"
		 *   location; i.e., a location cannot be moved into one of its children.
		 */
		if (from_s_len == strlen(path))
			return 0;
		_set_err(EINVAL, "Invalid attempt to move parent under a child");
		return -1;
	}

	rc = json_pointer_get_internal(*res, from_s, &from);
	if (rc)
	{
		_set_err_from_ptrget(errno, "from");
		return rc;
	}

	// Note: it's impossible for json_pointer to find the root obj, due
	// to the path check above, so from.parent is guaranteed non-NULL
	json_object_get(from.obj);

	if (!move) {
		array_set_cb = json_object_array_insert_idx_cb;
	} else {
		rc = __json_patch_apply_remove(&from);
		if (rc < 0) {
			json_object_put(from.obj);
			return rc;
		}
		array_set_cb = json_object_array_move_cb;
	}

	rc = json_pointer_set_with_array_cb(res, path, from.obj, array_set_cb, &from);
	if (rc)
	{
		_set_err(errno, "Failed to set value at path referenced by 'path' field");
		json_object_put(from.obj);
	}

	return rc;
}